

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

MOJOSHADER_effectTechnique *
MOJOSHADER_effectFindNextValidTechnique
          (MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  int local_24;
  int i;
  MOJOSHADER_effectTechnique *technique_local;
  MOJOSHADER_effect *effect_local;
  
  if (technique == (MOJOSHADER_effectTechnique *)0x0) {
    effect_local = (MOJOSHADER_effect *)effect->techniques;
  }
  else {
    local_24 = 0;
    while( true ) {
      if (effect->technique_count <= local_24) {
        __assert_fail("0 && \"Technique is not part of this effect!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                      ,0x6bd,
                      "const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
                     );
      }
      if (technique == effect->techniques + local_24) break;
      local_24 = local_24 + 1;
    }
    if (local_24 == effect->technique_count + -1) {
      effect_local = (MOJOSHADER_effect *)0x0;
    }
    else {
      effect_local = (MOJOSHADER_effect *)(effect->techniques + (local_24 + 1));
    }
  }
  return (MOJOSHADER_effectTechnique *)effect_local;
}

Assistant:

const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *effect,
                                                                          const MOJOSHADER_effectTechnique *technique
)
{
    int i;
    if (technique == NULL)
        return &effect->techniques[0];
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            if (i == effect->technique_count - 1)
                return NULL; /* We were passed the last technique! */
            return &effect->techniques[i + 1];
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}